

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::RecyclablePromiseObjectWalker::Get
          (RecyclablePromiseObjectWalker *this,int i,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptPromise *pJVar4;
  undefined4 *puVar5;
  JavascriptString *aValue;
  IDiagObjectModelDisplay *pIVar6;
  RecyclableObject *this_00;
  char16 *value;
  JavascriptLibrary *this_01;
  Type TVar7;
  
  pJVar4 = VarTo<Js::JavascriptPromise>((this->super_RecyclableObjectWalker).instance);
  if (i == 1) {
    pResolvedObject->name = L"[value]";
    aValue = (JavascriptString *)(pJVar4->result).ptr;
    if (aValue == (JavascriptString *)0x0) goto switchD_007f0c90_caseD_0;
    goto LAB_007f0dae;
  }
  if (i != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf1c,"(false)","false");
    if (bVar2) {
      *puVar5 = 0;
      return 0;
    }
    goto LAB_007f0f2e;
  }
  pResolvedObject->name = L"[status]";
  switch(pJVar4->status) {
  case PromiseStatusCode_Unresolved:
    aValue = JavascriptLibrary::CreateStringFromCppLiteral<8ul>
                       ((((this->super_RecyclableObjectWalker).scriptContext)->
                        super_ScriptContextBase).javascriptLibrary,(char16 (*) [8])0xe70826);
    break;
  case PromiseStatusCode_HasResolution:
    this_01 = (((this->super_RecyclableObjectWalker).scriptContext)->super_ScriptContextBase).
              javascriptLibrary;
    value = L"resolved";
    goto LAB_007f0d40;
  case PromiseStatusCode_HasRejection:
    this_01 = (((this->super_RecyclableObjectWalker).scriptContext)->super_ScriptContextBase).
              javascriptLibrary;
    value = L"rejected";
LAB_007f0d40:
    aValue = JavascriptLibrary::CreateStringFromCppLiteral<9ul>(this_01,(char16 (*) [9])value);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf0f,"(false)","New PromiseStatusCode not handled in debugger");
    if (!bVar2) goto LAB_007f0f2e;
    *puVar5 = 0;
  case PromiseStatusCode_Undefined:
switchD_007f0c90_caseD_0:
    aValue = StringCache::GetUndefinedDisplay
                       (&((((this->super_RecyclableObjectWalker).scriptContext)->
                          super_ScriptContextBase).javascriptLibrary)->stringCache);
  }
LAB_007f0dae:
  pResolvedObject->obj = aValue;
  pResolvedObject->propId = -1;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  if (aValue == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_007f0f2e;
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    TVar7 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)aValue >> 0x32 != 0) {
      TVar7 = TypeIds_Number;
      goto LAB_007f0e2f;
    }
    this_00 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_007f0f2e;
      *puVar5 = 0;
    }
    TVar7 = ((this_00->type).ptr)->typeId;
    if ((0x57 < (int)TVar7) && (BVar3 = RecyclableObject::IsExternal(this_00), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_007f0f2e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
LAB_007f0e2f:
  pResolvedObject->typeId = TVar7;
  pIVar6 = ResolvedObject::CreateDisplay(pResolvedObject);
  pResolvedObject->objectDisplay = pIVar6;
  (*pIVar6->_vptr_IDiagObjectModelDisplay[6])(pIVar6,0x820);
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  return 1;
}

Assistant:

BOOL RecyclablePromiseObjectWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        JavascriptPromise* promise = VarTo<JavascriptPromise>(instance);

        if (i == 0)
        {
            pResolvedObject->name = _u("[status]");

            switch (promise->GetStatus())
            {
            case JavascriptPromise::PromiseStatusCode_Undefined:
                pResolvedObject->obj = scriptContext->GetLibrary()->GetUndefinedDisplayString();
                break;
            case JavascriptPromise::PromiseStatusCode_Unresolved:
                pResolvedObject->obj = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("pending"));
                break;
            case JavascriptPromise::PromiseStatusCode_HasResolution:
                pResolvedObject->obj = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("resolved"));
                break;
            case JavascriptPromise::PromiseStatusCode_HasRejection:
                pResolvedObject->obj = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("rejected"));
                break;
            default:
                AssertMsg(false, "New PromiseStatusCode not handled in debugger");
                pResolvedObject->obj = scriptContext->GetLibrary()->GetUndefinedDisplayString();
                break;
            }
        }
        else if (i == 1)
        {
            pResolvedObject->name = _u("[value]");
            Var result = promise->GetResult();
            pResolvedObject->obj = result != nullptr ? result : scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }
        else
        {
            Assert(false);
            return FALSE;
        }

        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->objectDisplay = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY | DBGPROP_ATTRIB_VALUE_IS_FAKE);
        pResolvedObject->address = nullptr;

        return TRUE;
    }